

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O3

void __thiscall
ON_DimStyle::ON_DimStyle
          (ON_DimStyle *this,LengthUnitSystem model_length_unit_system,ON_V5x_DimStyle *src)

{
  double *pdVar1;
  LengthDisplay *v6_dimension_length_display;
  field field_id;
  LengthDisplay LVar2;
  double dVar3;
  undefined8 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined4 uVar7;
  unsigned_short uVar8;
  unsigned_short uVar9;
  ON_Color OVar10;
  ON__UINT8 OVar11;
  ON__UINT8 OVar12;
  ON__UINT8 OVar13;
  ON__UINT8 OVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  suppress_zero zero_suppress;
  arrow_type aVar21;
  ON_TextStyle *this_00;
  ON_Font *font_characteristics;
  MaskType MVar22;
  uint uVar23;
  size_t i;
  long lVar24;
  
  ON_ModelComponent::ON_ModelComponent(&this->super_ON_ModelComponent,&src->super_ON_ModelComponent)
  ;
  (this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object =
       (_func_int **)&PTR_ClassId_0080f070;
  this->m_extextension = 0.5;
  this->m_extoffset = 0.5;
  this->m_arrowsize = 1.0;
  this->m_leaderarrowsize = 1.0;
  this->m_centermark = 0.5;
  this->m_centermark_style = Mark;
  this->m_textgap = 0.25;
  this->m_textheight = 1.0;
  this->m_dim_text_location = AboveDimLine;
  this->m_dimradial_text_location = InDimLine;
  this->m_angleformat = DecimalDegrees;
  this->m_angleresolution = 2;
  this->m_dimension_length_display = ModelUnits;
  this->m_alternate_dimension_length_display = ModelUnits;
  this->m_lengthresolution = 2;
  this->m_alternate_lengthresolution = 2;
  this->m_lengthfactor = 1.0;
  this->m_alternate_lengthfactor = 1.0;
  ON_Font::ON_Font(&this->m_font_characteristics,&ON_Font::Default);
  this->m_managed_font = &ON_Font::Default;
  *(undefined4 *)((this->m_content_hash).m_digest + 0x10) =
       ON_SHA1_Hash::EmptyContentHash.m_digest._16_4_;
  uVar4 = ON_SHA1_Hash::EmptyContentHash.m_digest._8_8_;
  *(undefined8 *)(this->m_content_hash).m_digest = ON_SHA1_Hash::EmptyContentHash.m_digest._0_8_;
  *(undefined8 *)((this->m_content_hash).m_digest + 8) = uVar4;
  *(undefined4 *)((this->m_text_position_properties_hash).m_digest + 0x10) =
       ON_SHA1_Hash::EmptyContentHash.m_digest._16_4_;
  uVar4 = ON_SHA1_Hash::EmptyContentHash.m_digest._8_8_;
  *(undefined8 *)(this->m_text_position_properties_hash).m_digest =
       ON_SHA1_Hash::EmptyContentHash.m_digest._0_8_;
  *(undefined8 *)((this->m_text_position_properties_hash).m_digest + 8) = uVar4;
  uVar4 = ON_SHA1_Hash::EmptyContentHash.m_digest._8_8_;
  *(undefined8 *)(this->m_reserved_hash2).m_digest = ON_SHA1_Hash::EmptyContentHash.m_digest._0_8_;
  *(undefined8 *)((this->m_reserved_hash2).m_digest + 8) = uVar4;
  *(undefined4 *)((this->m_reserved_hash2).m_digest + 0x10) =
       ON_SHA1_Hash::EmptyContentHash.m_digest._16_4_;
  uVar4 = ON_SHA1_Hash::EmptyContentHash.m_digest._8_8_;
  *(undefined8 *)(this->m_parent_dim_style_content_hash).m_digest =
       ON_SHA1_Hash::EmptyContentHash.m_digest._0_8_;
  *(undefined8 *)((this->m_parent_dim_style_content_hash).m_digest + 8) = uVar4;
  *(undefined4 *)((this->m_parent_dim_style_content_hash).m_digest + 0x10) =
       ON_SHA1_Hash::EmptyContentHash.m_digest._16_4_;
  this->m_bAlternate = false;
  this->m_bForceDimLine = true;
  this->m_ArrowFit = Auto;
  this->m_TextFit = Auto;
  this->m_decimal_separator = L'.';
  ON_wString::ON_wString(&this->m_prefix);
  ON_wString::ON_wString(&this->m_suffix);
  ON_wString::ON_wString(&this->m_alternate_prefix);
  ON_wString::ON_wString(&this->m_alternate_suffix);
  this->m_field_override_parent_bits0 = 0;
  this->m_field_override_parent_bits1 = 0;
  this->m_field_override_parent_bits2 = 0;
  this->m_field_override_parent_bits3 = 0;
  this->m_dimextension = 0.0;
  this->m_bSuppressExtension1 = false;
  this->m_bSuppressExtension2 = false;
  this->m_bReserved1 = false;
  this->m_bReserved2 = false;
  this->m_field_override_parent_count = 0;
  this->m_tolerance_format = None;
  this->m_tolerance_resolution = 4;
  this->m_tolerance_upper_value = 0.0;
  this->m_tolerance_lower_value = 0.0;
  this->m_tolerance_height_scale = 0.7;
  this->m_baseline_spacing = 3.0;
  uVar15 = ON_TextMask::None.m_content_hash.m_digest._4_8_;
  uVar4 = ON_TextMask::None._16_8_;
  dVar3 = ON_TextMask::None.m_mask_border;
  MVar22 = ON_TextMask::None.m_mask_type;
  uVar5 = ON_TextMask::None.m_mask_frame;
  uVar6 = ON_TextMask::None.m_reserved2;
  uVar7 = ON_TextMask::None.m_mask_color.field_0;
  (this->m_text_mask).m_bDrawMask = ON_TextMask::None.m_bDrawMask;
  (this->m_text_mask).m_mask_type = MVar22;
  (this->m_text_mask).m_mask_frame = uVar5;
  (this->m_text_mask).m_reserved2 = uVar6;
  (this->m_text_mask).m_mask_color = (ON_Color)uVar7;
  (this->m_text_mask).m_mask_border = dVar3;
  uVar16 = ON_TextMask::None._16_8_;
  ON_TextMask::None.m_reserved3 = (uint)uVar4;
  ON_TextMask::None.m_content_hash.m_digest[0] = SUB81(uVar4,4);
  OVar11 = ON_TextMask::None.m_content_hash.m_digest[0];
  ON_TextMask::None.m_content_hash.m_digest[1] = SUB81(uVar4,5);
  OVar12 = ON_TextMask::None.m_content_hash.m_digest[1];
  ON_TextMask::None.m_content_hash.m_digest[2] = SUB81(uVar4,6);
  OVar13 = ON_TextMask::None.m_content_hash.m_digest[2];
  ON_TextMask::None.m_content_hash.m_digest[3] = SUB81(uVar4,7);
  OVar14 = ON_TextMask::None.m_content_hash.m_digest[3];
  (this->m_text_mask).m_reserved3 = ON_TextMask::None.m_reserved3;
  ON_TextMask::None._16_8_ = uVar16;
  (this->m_text_mask).m_content_hash.m_digest[0] = OVar11;
  (this->m_text_mask).m_content_hash.m_digest[1] = OVar12;
  (this->m_text_mask).m_content_hash.m_digest[2] = OVar13;
  (this->m_text_mask).m_content_hash.m_digest[3] = OVar14;
  *(undefined8 *)((this->m_text_mask).m_content_hash.m_digest + 4) = uVar15;
  *(undefined8 *)((this->m_text_mask).m_content_hash.m_digest + 0xc) =
       ON_TextMask::None.m_content_hash.m_digest._12_8_;
  this->m_dimscale_source = 0;
  (this->m_source_dimstyle).Data1 = 0;
  (this->m_source_dimstyle).Data2 = 0;
  (this->m_source_dimstyle).Data3 = 0;
  (this->m_source_dimstyle).Data4[0] = '\0';
  (this->m_source_dimstyle).Data4[1] = '\0';
  (this->m_source_dimstyle).Data4[2] = '\0';
  (this->m_source_dimstyle).Data4[3] = '\0';
  (this->m_source_dimstyle).Data4[4] = '\0';
  (this->m_source_dimstyle).Data4[5] = '\0';
  (this->m_source_dimstyle).Data4[6] = '\0';
  (this->m_source_dimstyle).Data4[7] = '\0';
  this->m_ext_line_color_source = '\0';
  OVar10 = ON_Color::Black;
  this->m_dim_line_color_source = '\0';
  this->m_arrow_color_source = '\0';
  this->m_text_color_source = '\0';
  (this->m_ext_line_color).field_0 = ON_Color::Black.field_0;
  (this->m_dim_line_color).field_0 = OVar10.field_0;
  (this->m_arrow_color).field_0 = OVar10.field_0;
  (this->m_text_color).field_0 = OVar10.field_0;
  this->m_ext_line_plot_color_source = '\0';
  this->m_dim_line_plot_color_source = '\0';
  this->m_arrow_plot_color_source = '\0';
  this->m_text_plot_color_source = '\0';
  (this->m_ext_line_plot_color).field_0 = OVar10.field_0;
  (this->m_dim_line_plot_color).field_0 = OVar10.field_0;
  (this->m_arrow_plot_color).field_0 = OVar10.field_0;
  (this->m_text_plot_color).field_0 = OVar10.field_0;
  this->m_ext_line_plot_weight_source = '\0';
  this->m_dim_line_plot_weight_source = '\0';
  this->m_ext_line_plot_weight_mm = 0.0;
  this->m_dim_line_plot_weight_mm = 0.0;
  this->m_fixed_extension_len = 1.0;
  this->m_fixed_extension_len_on = false;
  this->m_ReservedChar1 = '\0';
  this->m_ReservedShort1 = 0;
  this->m_ReservedInt1 = 0;
  this->m_text_rotation = 0.0;
  this->m_alternate_tolerance_resolution = 4;
  this->m_tol_textheight_fraction = 0.6;
  this->m_suppress_arrow1 = false;
  this->m_suppress_arrow2 = false;
  this->m_ReservedShort2 = 0;
  this->m_textmove_leader = 0;
  this->m_arclength_sym = 0;
  this->m_stack_textheight_fraction = 0.7;
  this->m_stack_format = StackHorizontal;
  this->m_alt_round = 0.0;
  this->m_round = 0.0;
  *(undefined8 *)((long)&this->m_round + 4) = 0;
  *(undefined8 *)((long)&this->m_angular_round + 4) = 0;
  this->m_arrow_type_1 = SolidTriangle;
  this->m_arrow_type_2 = SolidTriangle;
  this->m_leader_arrow_type = SolidTriangle;
  (this->m_arrow_block_id_1).Data1 = 0;
  (this->m_arrow_block_id_1).Data2 = 0;
  (this->m_arrow_block_id_1).Data3 = 0;
  (this->m_arrow_block_id_1).Data4[0] = '\0';
  (this->m_arrow_block_id_1).Data4[1] = '\0';
  (this->m_arrow_block_id_1).Data4[2] = '\0';
  (this->m_arrow_block_id_1).Data4[3] = '\0';
  (this->m_arrow_block_id_1).Data4[4] = '\0';
  (this->m_arrow_block_id_1).Data4[5] = '\0';
  (this->m_arrow_block_id_1).Data4[6] = '\0';
  (this->m_arrow_block_id_1).Data4[7] = '\0';
  (this->m_arrow_block_id_2).Data1 = 0;
  (this->m_arrow_block_id_2).Data2 = 0;
  (this->m_arrow_block_id_2).Data3 = 0;
  (this->m_arrow_block_id_2).Data4[0] = '\0';
  (this->m_arrow_block_id_2).Data4[1] = '\0';
  (this->m_arrow_block_id_2).Data4[2] = '\0';
  (this->m_arrow_block_id_2).Data4[3] = '\0';
  (this->m_arrow_block_id_2).Data4[4] = '\0';
  (this->m_arrow_block_id_2).Data4[5] = '\0';
  (this->m_arrow_block_id_2).Data4[6] = '\0';
  (this->m_arrow_block_id_2).Data4[7] = '\0';
  (this->m_leader_arrow_block_id).Data1 = 0;
  (this->m_leader_arrow_block_id).Data2 = 0;
  (this->m_leader_arrow_block_id).Data3 = 0;
  (this->m_leader_arrow_block_id).Data4[0] = '\0';
  (this->m_leader_arrow_block_id).Data4[1] = '\0';
  (this->m_leader_arrow_block_id).Data4[2] = '\0';
  (this->m_leader_arrow_block_id).Data4[3] = '\0';
  (this->m_leader_arrow_block_id).Data4[4] = '\0';
  (this->m_leader_arrow_block_id).Data4[5] = '\0';
  (this->m_leader_arrow_block_id).Data4[6] = '\0';
  (this->m_leader_arrow_block_id).Data4[7] = '\0';
  this->m_text_vertical_alignment = Top;
  this->m_text_horizontal_alignment = Left;
  this->m_leader_text_vertical_alignment = Middle;
  this->m_leader_text_horizontal_alignment = Left;
  this->m_leader_content_angle_style = Horizontal;
  this->m_leader_curve_type = Polyline;
  this->m_leader_content_angle = 0.0;
  this->m_leader_has_landing = true;
  this->m_leader_landing_length = 1.0;
  this->m_draw_forward = true;
  this->m_signed_ordinate = true;
  ON_ScaleValue::ON_ScaleValue(&this->m_scale_value,&ON_ScaleValue::OneToOne);
  this->m_dimstyle_unitsystem = None;
  this->m_text_orientation = InPlane;
  this->m_leader_text_orientation = InPlane;
  this->m_dim_text_orientation = InPlane;
  this->m_dimradial_text_orientation = InPlane;
  this->m_dim_text_angle_style = Aligned;
  this->m_dimradial_text_angle_style = Horizontal;
  this->m_text_underlined = false;
  this->m_parent_dimstyle_managed_font = (ON_Font *)0x0;
  bVar17 = ON_ModelComponent::ParentIdIsNotNil(&src->super_ON_ModelComponent);
  if (bVar17 && src->m_field_override_count != 0) {
    lVar24 = 0;
    do {
      if ((((&GetDimStyleFieldIdMap(unsigned_long*)::field_id_map)[lVar24 * 2] != fn_unset) &&
          (field_id = (&DAT_006abab4)[lVar24 * 2], Index < field_id)) &&
         (bVar17 = ON_V5x_DimStyle::IsFieldOverride
                             (src,(&GetDimStyleFieldIdMap(unsigned_long*)::field_id_map)[lVar24 * 2]
                             ), bVar17)) {
        SetFieldOverride(this,field_id,true);
      }
      lVar24 = lVar24 + 1;
    } while (lVar24 != 0x55);
    bVar18 = ON_V5x_DimStyle::IsFieldOverride(src,fn_lengthformat);
    bVar19 = ON_V5x_DimStyle::IsFieldOverride(src,fn_alternate_lengthformat);
    bVar17 = ON_V5x_DimStyle::IsFieldOverride(src,fn_lengthfactor);
    bVar20 = ON_V5x_DimStyle::IsFieldOverride(src,fn_alternate_lengthfactor);
  }
  else {
    bVar18 = false;
    bVar19 = false;
    bVar20 = false;
    bVar17 = false;
  }
  dVar3 = src->m_extoffset;
  this->m_extextension = src->m_extextension;
  this->m_extoffset = dVar3;
  this->m_arrowsize = src->m_arrowsize;
  this->m_centermark = src->m_centermark;
  dVar3 = src->m_textheight;
  this->m_textgap = src->m_textgap;
  this->m_textheight = dVar3;
  switch(src->m_dimstyle_textalign) {
  case kNormal:
  case kAboveLine:
    this->m_dim_text_location = AboveDimLine;
    this->m_dimradial_text_location = InDimLine;
    break;
  case kHorizontalToScreen:
    this->m_dim_text_location = InDimLine;
    this->m_dimradial_text_location = InDimLine;
    this->m_leader_text_orientation = InView;
    this->m_dim_text_orientation = InView;
    this->m_dimradial_text_orientation = InView;
    break;
  case kInLine:
    this->m_dim_text_location = InDimLine;
    this->m_dimradial_text_location = InDimLine;
    break;
  case kHorizontalInCplane:
    this->m_dim_text_location = InDimLine;
    this->m_dimradial_text_location = InDimLine;
    this->m_dim_text_angle_style = Horizontal;
    break;
  default:
    goto switchD_0044d0ba_default;
  }
  this->m_dimradial_text_angle_style = Horizontal;
switchD_0044d0ba_default:
  pdVar1 = &this->m_lengthfactor;
  aVar21 = Default.m_arrow_type_1;
  if ((uint)src->m_arrowtype < 8) {
    aVar21 = src->m_arrowtype + SolidTriangle;
  }
  this->m_arrow_type_1 = aVar21;
  this->m_arrow_type_2 = aVar21;
  this->m_angleformat = DecimalDegrees;
  LVar2 = this->m_dimension_length_display;
  Internal_V6LengthDisplayFromV5LengthFormatAndFactor
            (model_length_unit_system,src->m_lengthformat,src->m_lengthfactor,
             &this->m_dimension_length_display,pdVar1);
  if ((bVar18 | bVar17) == 1) {
    if (LVar2 != this->m_dimension_length_display) {
      SetFieldOverride(this,DimensionLengthDisplay,true);
      if ((*pdVar1 == 1.0) && (!NAN(*pdVar1))) {
        SetFieldOverride(this,LengthFactor,false);
      }
    }
    if (bVar17 == true && *pdVar1 != src->m_lengthfactor) {
      SetFieldOverride(this,LengthFactor,false);
    }
  }
  v6_dimension_length_display = &this->m_alternate_dimension_length_display;
  pdVar1 = &this->m_alternate_lengthfactor;
  LVar2 = *v6_dimension_length_display;
  Internal_V6LengthDisplayFromV5LengthFormatAndFactor
            (model_length_unit_system,src->m_alternate_lengthformat,src->m_alternate_lengthfactor,
             v6_dimension_length_display,pdVar1);
  if ((bVar19 | bVar20) == 1) {
    if (LVar2 != *v6_dimension_length_display) {
      SetFieldOverride(this,AlternateDimensionLengthDisplay,true);
      if ((*pdVar1 == 1.0) && (!NAN(*pdVar1))) {
        SetFieldOverride(this,AlternateLengthFactor,false);
      }
    }
    if (bVar20 == true && *pdVar1 != src->m_alternate_lengthfactor) {
      SetFieldOverride(this,AlternateLengthFactor,false);
    }
  }
  this->m_lengthresolution = src->m_lengthresolution;
  this->m_angleresolution = src->m_angleresolution;
  this_00 = ON_V5x_DimStyle::V5TextStyle(src);
  font_characteristics = ON_TextStyle::Font(this_00);
  SetFont(this,font_characteristics);
  this->m_bAlternate = src->m_bAlternate;
  this->m_alternate_lengthresolution = src->m_alternate_lengthresolution;
  ON_wString::operator=(&this->m_prefix,&src->m_prefix);
  ON_wString::operator=(&this->m_suffix,&src->m_suffix);
  ON_wString::operator=(&this->m_alternate_prefix,&src->m_alternate_prefix);
  ON_wString::operator=(&this->m_alternate_suffix,&src->m_alternate_suffix);
  this->m_dimextension = src->m_dimextension;
  this->m_leaderarrowsize = src->m_leaderarrowsize;
  aVar21 = Default.m_arrow_type_1;
  if ((uint)src->m_leaderarrowtype < 8) {
    aVar21 = src->m_leaderarrowtype + SolidTriangle;
  }
  this->m_leader_arrow_type = aVar21;
  this->m_bSuppressExtension1 = src->m_bSuppressExtension1;
  this->m_bSuppressExtension2 = src->m_bSuppressExtension2;
  uVar8 = (src->m_source_dimstyle).Data2;
  uVar9 = (src->m_source_dimstyle).Data3;
  uVar4 = *(undefined8 *)(src->m_source_dimstyle).Data4;
  (this->m_source_dimstyle).Data1 = (src->m_source_dimstyle).Data1;
  (this->m_source_dimstyle).Data2 = uVar8;
  (this->m_source_dimstyle).Data3 = uVar9;
  *(undefined8 *)(this->m_source_dimstyle).Data4 = uVar4;
  uVar23 = 0;
  if ((uint)src->m_tolerance_style < 4) {
    uVar23 = src->m_tolerance_style;
  }
  this->m_tolerance_format = (tolerance_format)uVar23;
  this->m_tolerance_resolution = src->m_tolerance_resolution;
  dVar3 = src->m_tolerance_lower_value;
  this->m_tolerance_upper_value = src->m_tolerance_upper_value;
  this->m_tolerance_lower_value = dVar3;
  dVar3 = src->m_baseline_spacing;
  this->m_tolerance_height_scale = src->m_tolerance_height_scale;
  this->m_baseline_spacing = dVar3;
  SetDrawTextMask(this,src->m_bDrawMask);
  MVar22 = ON_TextMask::None.m_mask_type;
  if (src->m_mask_color_source == 1) {
    MVar22 = MaskColor;
  }
  SetMaskFillType(this,MVar22);
  SetMaskColor(this,(ON_Color)(src->m_mask_color).field_0);
  SetMaskBorder(this,src->m_textgap);
  SetDimScale(this,src->m_dimscale);
  this->m_dimscale_source = src->m_dimscale_source;
  this->m_leader_landing_length = this->m_textheight;
  this->m_leader_content_angle_style =
       src->m_dimstyle_textalign != kHorizontalInCplane &&
       src->m_dimstyle_textalign != kHorizontalToScreen;
  this->m_leader_has_landing = false;
  if (this->m_dimension_length_display == FeetAndInches) {
    this->m_zero_suppress = SuppressZeroFeet;
    zero_suppress = SuppressZeroFeet;
  }
  else {
    zero_suppress = this->m_zero_suppress;
  }
  bVar17 = ZeroSuppressMatchesLengthDisplay(zero_suppress,this->m_dimension_length_display);
  if (!bVar17) {
    this->m_zero_suppress = None;
  }
  bVar17 = ZeroSuppressMatchesLengthDisplay
                     (this->m_alt_zero_suppress,this->m_alternate_dimension_length_display);
  if (!bVar17) {
    this->m_alt_zero_suppress = None;
  }
  bVar17 = ZeroSuppressMatchesLengthDisplay(this->m_ang_zero_suppress,ModelUnits);
  if (!bVar17) {
    this->m_ang_zero_suppress = None;
  }
  return;
}

Assistant:

ON_DimStyle::ON_DimStyle(
  ON::LengthUnitSystem model_length_unit_system,
  const ON_V5x_DimStyle& src
)
  : ON_ModelComponent(src)
{
  // ON_ModelComponent(src) copies the parent id

  bool bV5LengthFactorOverride = false;
  bool bV5AltLengthFactorOverride = false;
  bool bV5LengthFormatOverride = false;
  bool bV5AltLengthFormatOverride = false;

  if ( src.ParentIdIsNotNil() && src.m_field_override_count > 0)
  {
    // src.m_field_override_count > 0) indicates some of the settings on the V5 dimstyle
    // are independent of the parent dimstyle. When we find those, 
    // we will set them on this as well.
    size_t field_id_map_count = 0;
    const struct V5_to_V6_field_id_map* field_id_map = GetDimStyleFieldIdMap(&field_id_map_count);
    for (size_t i = 0; i < field_id_map_count; i++)
    {
      if (ON_V5x_DimStyle::Field::fn_unset == field_id_map[i].m_v5_field_id)
        continue; // no mapping from V6 setting to V6 ON_V5x_DimStyle
      if (ON_DimStyle::field::Unset == field_id_map[i].m_v6_field_id)
        continue; // no mapping from V5 setting to V6 ON_DimStyle
      if (ON_DimStyle::field::Name == field_id_map[i].m_v6_field_id || ON_DimStyle::field::Index == field_id_map[i].m_v6_field_id)
        continue; // name and index are never from parent
      if (src.IsFieldOverride(field_id_map[i].m_v5_field_id))
        this->SetFieldOverride(field_id_map[i].m_v6_field_id, true);
    }

    // Now handle obsolete overrides that convert to dimension length display override
    bV5LengthFormatOverride = src.IsFieldOverride(ON_V5x_DimStyle::Field::fn_lengthformat);
    bV5AltLengthFormatOverride = src.IsFieldOverride(ON_V5x_DimStyle::Field::fn_alternate_lengthformat);
    bV5LengthFactorOverride = src.IsFieldOverride(ON_V5x_DimStyle::Field::fn_lengthfactor);
    bV5AltLengthFactorOverride = src.IsFieldOverride(ON_V5x_DimStyle::Field::fn_alternate_lengthfactor);
  }

  m_extextension = src.m_extextension;
  m_extoffset = src.m_extoffset;
  m_arrowsize = src.m_arrowsize;
  m_centermark = src.m_centermark;
  m_textgap = src.m_textgap;
  m_textheight = src.m_textheight;


  // V5 had a single ON_INTERNAL_OBSOLETE::V5_TextDisplayMode enum
  // V6 has 8 separate settings and 2 enums
  switch (src.m_dimstyle_textalign)
  {
  case ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kNormal:
    m_dim_text_location = ON_DimStyle::TextLocation::AboveDimLine;
    m_dimradial_text_location = ON_DimStyle::TextLocation::InDimLine;
    m_dimradial_text_angle_style = ON_DimStyle::ContentAngleStyle::Horizontal;
    break;

  case ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kHorizontalToScreen:
    m_dim_text_location = ON_DimStyle::TextLocation::InDimLine;
    m_dimradial_text_location = ON_DimStyle::TextLocation::InDimLine;
    m_leader_text_orientation     = ON::TextOrientation::InView;
    m_dim_text_orientation        = ON::TextOrientation::InView;
    m_dimradial_text_orientation  = ON::TextOrientation::InView;
    m_dimradial_text_angle_style = ON_DimStyle::ContentAngleStyle::Horizontal;
    break;

  case ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kAboveLine:
    m_dim_text_location = ON_DimStyle::TextLocation::AboveDimLine;
    m_dimradial_text_location = ON_DimStyle::TextLocation::InDimLine;
    m_dimradial_text_angle_style = ON_DimStyle::ContentAngleStyle::Horizontal;
    break;

  case ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kInLine:
    m_dim_text_location = ON_DimStyle::TextLocation::InDimLine;
    m_dimradial_text_location = ON_DimStyle::TextLocation::InDimLine;
    m_dimradial_text_angle_style = ON_DimStyle::ContentAngleStyle::Horizontal;
    break;

  case ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kHorizontalInCplane:
    m_dim_text_location = ON_DimStyle::TextLocation::InDimLine;
    m_dimradial_text_location = ON_DimStyle::TextLocation::InDimLine;
    m_dim_text_angle_style = ON_DimStyle::ContentAngleStyle::Horizontal;
    m_dimradial_text_angle_style = ON_DimStyle::ContentAngleStyle::Horizontal;
    break;
  }

  m_arrow_type_1 = V6ArrowType(src.m_arrowtype);
  m_arrow_type_2 = V6ArrowType(src.m_arrowtype);
  m_angleformat = ON_DimStyle::angle_format::DecimalDegrees;

  // Set m_dimension_length_display and m_lengthfactor
  const ON_DimStyle::LengthDisplay dimension_length_display0 = m_dimension_length_display;
  Internal_V6LengthDisplayFromV5LengthFormatAndFactor(
    model_length_unit_system,
    src.m_lengthformat, // 0 = decimal, 1 = fractional, 2 = feet and inches
    src.m_lengthfactor,
    m_dimension_length_display,
    m_lengthfactor
  );
  if (bV5LengthFormatOverride || bV5LengthFactorOverride)
  {
    if (dimension_length_display0 != m_dimension_length_display)
    {
      this->SetFieldOverride(ON_DimStyle::field::DimensionLengthDisplay, true);
      if ( 1.0 == m_lengthfactor )
        this->SetFieldOverride(ON_DimStyle::field::LengthFactor, false);
    }
    if( m_lengthfactor != src.m_lengthfactor && bV5LengthFactorOverride)
      this->SetFieldOverride(ON_DimStyle::field::LengthFactor, false);
  }

  // Set m_alternate_dimension_length_display and m_alternate_lengthfactor
  const ON_DimStyle::LengthDisplay alternate_dimension_length_display0 = m_alternate_dimension_length_display;
  Internal_V6LengthDisplayFromV5LengthFormatAndFactor(
    model_length_unit_system,
    src.m_alternate_lengthformat, // 0 = decimal, 1 = fractional, 2 = feet and inches
    src.m_alternate_lengthfactor,
    m_alternate_dimension_length_display,
    m_alternate_lengthfactor
  );
  if (bV5AltLengthFormatOverride || bV5AltLengthFactorOverride)
  {
    if (alternate_dimension_length_display0 != m_alternate_dimension_length_display)
    {
      this->SetFieldOverride(ON_DimStyle::field::AlternateDimensionLengthDisplay, true);
      if ( 1.0 == m_alternate_lengthfactor )
        this->SetFieldOverride(ON_DimStyle::field::AlternateLengthFactor, false);
    }
    if( m_alternate_lengthfactor != src.m_alternate_lengthfactor && bV5AltLengthFactorOverride)
      this->SetFieldOverride(ON_DimStyle::field::AlternateLengthFactor, false);
  }

  m_lengthresolution = src.m_lengthresolution;
  m_angleresolution = src.m_angleresolution;
  SetFont( src.V5TextStyle().Font() );
  m_bAlternate = src.m_bAlternate;

  m_alternate_lengthresolution = src.m_alternate_lengthresolution;
  m_prefix = src.m_prefix;
  m_suffix = src.m_suffix;
  m_alternate_prefix = src.m_alternate_prefix;
  m_alternate_suffix = src.m_alternate_suffix;
  m_dimextension = src.m_dimextension;
  m_leaderarrowsize = src.m_leaderarrowsize;
  m_leader_arrow_type = V6ArrowType(src.m_leaderarrowtype);
  m_bSuppressExtension1 = src.m_bSuppressExtension1;
  m_bSuppressExtension2 = src.m_bSuppressExtension2;
  m_source_dimstyle = src.m_source_dimstyle;
  m_tolerance_format = V6ToleranceFormat(src.m_tolerance_style);
  m_tolerance_resolution = src.m_tolerance_resolution;
  m_tolerance_upper_value = src.m_tolerance_upper_value;
  m_tolerance_lower_value = src.m_tolerance_lower_value;
  m_tolerance_height_scale = src.m_tolerance_height_scale;
  m_baseline_spacing = src.m_baseline_spacing;
  SetDrawTextMask(src.m_bDrawMask);
  SetMaskFillType(V6MaskTypeFromV5MaskColorSource(src.m_mask_color_source));
  SetMaskColor(src.m_mask_color);
  SetMaskBorder(src.m_textgap);
  //m_dimscale = src.m_dimscale;
  SetDimScale( src.m_dimscale); // sets m_scale_value and m_dimscale fields.
  m_dimscale_source = src.m_dimscale_source;
  m_leader_landing_length = m_textheight;

  switch (src.m_dimstyle_textalign)
  {

  case ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kHorizontalToScreen:
  case ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kHorizontalInCplane:
    m_leader_content_angle_style = ON_DimStyle::ContentAngleStyle::Horizontal;
    break;

  case ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kNormal:
  case ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kAboveLine:
  case ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kInLine:
  default:
    m_leader_content_angle_style = ON_DimStyle::ContentAngleStyle::Aligned;
    break;
  }

  m_leader_has_landing = false; // V5 had no landing concept.  V5 Leaders have an extra horizontal segment

  if (ON_DimStyle::LengthDisplay::FeetAndInches == m_dimension_length_display)
  {
    // this matches V5 default behavior.
    m_zero_suppress = ON_DimStyle::suppress_zero::SuppressZeroFeet;
  }


  // Make sure zero suppression settings are valid
  if (false == ON_DimStyle::ZeroSuppressMatchesLengthDisplay(m_zero_suppress, m_dimension_length_display))
    m_zero_suppress = ON_DimStyle::suppress_zero::None;

  if (false == ON_DimStyle::ZeroSuppressMatchesLengthDisplay(m_alt_zero_suppress, m_alternate_dimension_length_display))
    m_alt_zero_suppress = ON_DimStyle::suppress_zero::None;

  // any decimal format will do to test m_ang_zero_suppress
  if (false == ON_DimStyle::ZeroSuppressMatchesLengthDisplay(m_ang_zero_suppress, ON_DimStyle::LengthDisplay::ModelUnits))
    m_ang_zero_suppress = ON_DimStyle::suppress_zero::None;
}